

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lin_alg.c
# Opt level: O0

void mat_inf_norm_cols_sym_triu(csc *M,c_float *E)

{
  long lVar1;
  c_float local_48;
  c_float local_40;
  double local_38;
  c_float abs_x;
  c_int ptr;
  c_int j;
  c_int i;
  c_float *E_local;
  csc *M_local;
  
  for (j = 0; j < M->n; j = j + 1) {
    E[j] = 0.0;
  }
  for (j = 0; j < M->n; j = j + 1) {
    for (ptr = M->p[j]; ptr < M->p[j + 1]; ptr = ptr + 1) {
      lVar1 = M->i[ptr];
      if (0.0 < M->x[ptr] || M->x[ptr] == 0.0) {
        local_38 = M->x[ptr];
      }
      else {
        local_38 = -M->x[ptr];
      }
      if (local_38 < E[j] || local_38 == E[j]) {
        local_40 = E[j];
      }
      else {
        local_40 = local_38;
      }
      E[j] = local_40;
      if (lVar1 != j) {
        if (local_38 < E[lVar1] || local_38 == E[lVar1]) {
          local_48 = E[lVar1];
        }
        else {
          local_48 = local_38;
        }
        E[lVar1] = local_48;
      }
    }
  }
  return;
}

Assistant:

void mat_inf_norm_cols_sym_triu(const csc *M, c_float *E) {
  c_int   i, j, ptr;
  c_float abs_x;

  // Initialize zero max elements
  for (j = 0; j < M->n; j++) {
    E[j] = 0.;
  }

  // Compute maximum across columns
  // Note that element (i, j) contributes to
  // -> Column j (as expected in any matrices)
  // -> Column i (which is equal to row i for symmetric matrices)
  for (j = 0; j < M->n; j++) {
    for (ptr = M->p[j]; ptr < M->p[j + 1]; ptr++) {
      i     = M->i[ptr];
      abs_x = c_absval(M->x[ptr]);
      E[j]  = c_max(abs_x, E[j]);

      if (i != j) {
        E[i] = c_max(abs_x, E[i]);
      }
    }
  }
}